

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

int sftp_attrsize(unsigned_long flags)

{
  uint uVar1;
  
  uVar1 = (uint)flags;
  return (uVar1 & 0xc) + (uVar1 & 1) * 8 + (uVar1 & 2) * 4 + 4;
}

Assistant:

static int sftp_attrsize(unsigned long flags)
{
    return 4 +                                 /* flags(4) */
           ((flags & LIBSSH2_SFTP_ATTR_SIZE) ? 8 : 0) +
           ((flags & LIBSSH2_SFTP_ATTR_UIDGID) ? 8 : 0) +
           ((flags & LIBSSH2_SFTP_ATTR_PERMISSIONS) ? 4 : 0) +
           ((flags & LIBSSH2_SFTP_ATTR_ACMODTIME) ? 8 : 0);
    /* atime + mtime as u32 */
}